

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price.h
# Opt level: O2

uint32_t rc_bittree_reverse_price(probability *probs,uint32_t bit_levels,uint32_t symbol)

{
  uint32_t uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = 0;
  uVar2 = 1;
  do {
    uVar3 = symbol & 1;
    symbol = symbol >> 1;
    uVar1 = uVar1 + lzma_rc_prices[(-uVar3 & 0x7f0 ^ (uint)probs[uVar2]) >> 4];
    bit_levels = bit_levels - 1;
    uVar2 = (ulong)(uVar3 + (int)uVar2 * 2);
  } while (bit_levels != 0);
  return uVar1;
}

Assistant:

static inline uint32_t
rc_bittree_reverse_price(const probability *const probs,
		uint32_t bit_levels, uint32_t symbol)
{
	uint32_t price = 0;
	uint32_t model_index = 1;

	do {
		const uint32_t bit = symbol & 1;
		symbol >>= 1;
		price += rc_bit_price(probs[model_index], bit);
		model_index = (model_index << 1) + bit;
	} while (--bit_levels != 0);

	return price;
}